

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O2

bool __thiscall QLayout::isEmpty(QLayout *this)

{
  char cVar1;
  long *plVar2;
  int i;
  int iVar3;
  
  iVar3 = 0;
  do {
    plVar2 = (long *)(**(code **)(*(long *)this + 0xa8))(this,iVar3);
    if (plVar2 == (long *)0x0) break;
    cVar1 = (**(code **)(*plVar2 + 0x40))(plVar2);
    iVar3 = iVar3 + 1;
  } while (cVar1 != '\0');
  return plVar2 == (long *)0x0;
}

Assistant:

bool QLayout::isEmpty() const
{
    int i = 0;
    QLayoutItem *item = itemAt(i);
    while (item) {
        if (!item->isEmpty())
            return false;
        ++i;
        item = itemAt(i);
    }
    return true;
}